

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

void jsonnet_json_object_append(JsonnetVm *vm,JsonnetJsonValue *obj,char *f,JsonnetJsonValue *v)

{
  mapped_type *this;
  int *in_RSI;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  if (*in_RSI == 4) {
    std::unique_ptr<JsonnetJsonValue,std::default_delete<JsonnetJsonValue>>::
    unique_ptr<std::default_delete<JsonnetJsonValue>,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
              );
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
                         *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator=
              (this,(unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                    in_stack_ffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::~unique_ptr(this);
    return;
  }
  __assert_fail("obj->kind == JsonnetJsonValue::OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/libjsonnet.cpp"
                ,200,
                "void jsonnet_json_object_append(JsonnetVm *, JsonnetJsonValue *, const char *, JsonnetJsonValue *)"
               );
}

Assistant:

void jsonnet_json_object_append(JsonnetVm *vm, JsonnetJsonValue *obj, const char *f,
                                JsonnetJsonValue *v)
{
    (void)vm;
    assert(obj->kind == JsonnetJsonValue::OBJECT);
    obj->fields[std::string(f)] = std::unique_ptr<JsonnetJsonValue>(v);
}